

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall cppcms::filters::anon_unknown_0::jsescape_buf::~jsescape_buf(jsescape_buf *this)

{
  void *in_RDI;
  
  ~jsescape_buf((jsescape_buf *)0x40d9c8);
  operator_delete(in_RDI);
  return;
}

Assistant:

jsescape_buf() 
			{
				buf_[0]='\\';
				buf_[1]= 'u';
				buf_[2]= '0';
				buf_[3]= '0';
				// 4 first digit
				// 5 2nd digit
				buf_[6]='\0';
			}